

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O0

void anon_unknown.dwarf_41187::parseInput(Module *wasm,WasmSplitOptions *options)

{
  const_reference pvVar1;
  byte local_54d;
  Fatal local_530;
  undefined1 local_3a1 [401];
  ParseException *p;
  bad_alloc *anon_var_0;
  string local_78 [48];
  string local_48 [36];
  undefined1 local_24 [8];
  ModuleReader reader;
  WasmSplitOptions *options_local;
  Module *wasm_local;
  
  reader._4_8_ = options;
  ::wasm::ToolOptions::applyOptionsBeforeParse(&options->super_ToolOptions,wasm);
  ::wasm::ModuleReader::ModuleReader((ModuleReader *)local_24);
  ::wasm::ModuleReader::setProfile((ModuleReader *)local_24,*(IRProfile *)(reader._4_8_ + 0x174));
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(reader._4_8_ + 0x238),0);
  std::__cxx11::string::string(local_48,(string *)pvVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"",(allocator<char> *)((long)&anon_var_0 + 7));
  ::wasm::ModuleReader::read(local_24,local_48,wasm,local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
  std::__cxx11::string::~string(local_48);
  ::wasm::ToolOptions::applyOptionsAfterParse((ToolOptions *)reader._4_8_,wasm);
  local_54d = 0;
  if ((*(byte *)(reader._4_8_ + 0xb9) & 1) != 0) {
    local_54d = ::wasm::WasmValidator::validate((Module *)local_3a1,(uint)wasm);
    local_54d = local_54d ^ 0xff;
  }
  if ((local_54d & 1) == 0) {
    return;
  }
  ::wasm::Fatal::Fatal(&local_530);
  ::wasm::Fatal::operator<<(&local_530,(char (*) [23])"error validating input");
  ::wasm::Fatal::~Fatal(&local_530);
}

Assistant:

void parseInput(Module& wasm, const WasmSplitOptions& options) {
  options.applyOptionsBeforeParse(wasm);
  ModuleReader reader;
  reader.setProfile(options.profile);
  try {
    reader.read(options.inputFiles[0], wasm);
  } catch (ParseException& p) {
    p.dump(std::cerr);
    std::cerr << '\n';
    Fatal() << "error parsing wasm";
  } catch (std::bad_alloc&) {
    Fatal() << "error building module, std::bad_alloc (possibly invalid "
               "request for silly amounts of memory)";
  }

  options.applyOptionsAfterParse(wasm);

  if (options.passOptions.validate && !WasmValidator().validate(wasm)) {
    Fatal() << "error validating input";
  }
}